

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Vector<kj::CompressionParameters> *
kj::_::findValidExtensionOffers
          (Vector<kj::CompressionParameters> *__return_storage_ptr__,StringPtr offers)

{
  undefined1 uVar1;
  bool bVar2;
  char in_R8B;
  ArrayPtr<const_char> *pAVar3;
  ArrayPtr<const_char> input;
  ArrayPtr<const_char> input_00;
  NullableValue<kj::CompressionParameters> _validated5087;
  Vector<kj::CompressionParameters> result;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_a8;
  Vector<kj::ArrayPtr<const_char>_> extensions;
  Vector<kj::ArrayPtr<const_char>_> splitOffer;
  NullableValue<kj::CompressionParameters> local_60;
  
  result.builder.endPtr = (CompressionParameters *)0x0;
  result.builder.ptr = (CompressionParameters *)0x0;
  result.builder.pos = (RemoveConst<kj::CompressionParameters> *)0x0;
  result.builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  input.ptr = (char *)(offers.content.size_ - 1);
  input.size_ = 0x2c;
  splitParts(&extensions,(_ *)offers.content.ptr,input,in_R8B);
  for (pAVar3 = extensions.builder.ptr; pAVar3 != extensions.builder.pos; pAVar3 = pAVar3 + 1) {
    input_00.size_ = 0x3b;
    input_00.ptr = (char *)pAVar3->size_;
    splitParts((Vector<kj::ArrayPtr<const_char>_> *)&splitOffer.builder,(_ *)pAVar3->ptr,input_00,
               in_R8B);
    _validated5087._0_8_ = anon_var_dwarf_a30c7e;
    _validated5087.field_1._0_8_ = 0x12;
    bVar2 = ArrayPtr<const_char>::operator==
                      (splitOffer.builder.ptr,(ArrayPtr<const_char> *)&_validated5087);
    if (bVar2) {
      tryExtractParameters
                ((Maybe<kj::CompressionParameters> *)&local_60,
                 (Vector<kj::ArrayPtr<const_char>_> *)&splitOffer.builder,false);
      NullableValue<kj::CompressionParameters>::NullableValue(&_validated5087,&local_60);
      uVar1 = _validated5087.field_1.value.inboundMaxWindowBits.ptr.isSet;
      if (_validated5087.isSet == true) {
        _validated5087.field_1._0_2_ =
             _validated5087.field_1._0_2_ << 8 | (ushort)_validated5087.field_1._0_2_ >> 8;
        if (_validated5087.field_1.value.inboundMaxWindowBits.ptr.isSet == true) {
          local_a8 = _validated5087.field_1.value.inboundMaxWindowBits.ptr.field_1;
          _validated5087.field_1.value.inboundMaxWindowBits.ptr.isSet = false;
        }
        if (_validated5087.field_1.value.outboundMaxWindowBits.ptr.isSet == true) {
          _validated5087.field_1.value.inboundMaxWindowBits.ptr.field_1 =
               _validated5087.field_1.value.outboundMaxWindowBits.ptr.field_1;
          _validated5087.field_1.value.inboundMaxWindowBits.ptr.isSet = true;
          _validated5087.field_1.value.outboundMaxWindowBits.ptr.isSet = false;
        }
        if ((bool)uVar1 != false) {
          _validated5087.field_1.value.outboundMaxWindowBits.ptr.field_1 = local_a8;
          _validated5087.field_1.value.outboundMaxWindowBits.ptr.isSet = true;
        }
        Vector<kj::CompressionParameters>::add<kj::CompressionParameters>
                  (&result,&_validated5087.field_1.value);
      }
    }
    ArrayBuilder<kj::ArrayPtr<const_char>_>::dispose(&splitOffer.builder);
  }
  (__return_storage_ptr__->builder).ptr = result.builder.ptr;
  (__return_storage_ptr__->builder).pos = result.builder.pos;
  (__return_storage_ptr__->builder).endPtr = result.builder.endPtr;
  (__return_storage_ptr__->builder).disposer = result.builder.disposer;
  result.builder.ptr = (CompressionParameters *)0x0;
  result.builder.pos = (RemoveConst<kj::CompressionParameters> *)0x0;
  result.builder.endPtr = (CompressionParameters *)0x0;
  ArrayBuilder<kj::ArrayPtr<const_char>_>::dispose(&extensions.builder);
  ArrayBuilder<kj::CompressionParameters>::dispose(&result.builder);
  return __return_storage_ptr__;
}

Assistant:

kj::Vector<CompressionParameters> findValidExtensionOffers(StringPtr offers) {
  // A function to be called by the client that wants to offer extensions through
  // `Sec-WebSocket-Extensions`. This function takes the value of the header (a string) and
  // populates a Vector of all the valid offers.
  kj::Vector<CompressionParameters> result;

  auto extensions = splitParts(offers, ',');

  for (const auto& offer : extensions) {
    auto splitOffer = splitParts(offer, ';');
    if (splitOffer.front() != "permessage-deflate"_kj) {
      continue;
    }
    KJ_IF_SOME(validated, tryExtractParameters(splitOffer, false)) {
      // We need to swap the inbound/outbound properties since `tryExtractParameters` thinks we're
      // parsing as the server (`isAgreement` is false).
      auto tempCtx = validated.inboundNoContextTakeover;
      validated.inboundNoContextTakeover = validated.outboundNoContextTakeover;
      validated.outboundNoContextTakeover = tempCtx;
      auto tempWindow = validated.inboundMaxWindowBits;
      validated.inboundMaxWindowBits = validated.outboundMaxWindowBits;
      validated.outboundMaxWindowBits = tempWindow;
      result.add(kj::mv(validated));
    }
  }

  return kj::mv(result);
}